

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_truetype.h
# Opt level: O2

void stbtt_PackFontRangesPackRects(stbtt_pack_context *spc,stbrp_rect *rects,int num_rects)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  int *piVar5;
  int iVar6;
  int *piVar7;
  int iVar8;
  int iVar9;
  
  piVar5 = (int *)spc->pack_info;
  uVar4 = 0;
  uVar2 = 0;
  if (0 < num_rects) {
    uVar2 = (ulong)(uint)num_rects;
  }
  piVar7 = &rects->was_packed;
  for (; uVar3 = uVar2, uVar2 != uVar4; uVar4 = uVar4 + 1) {
    iVar8 = piVar5[2];
    iVar1 = piVar7[-2];
    if (*piVar5 < iVar1 + iVar8) {
      piVar5[2] = 0;
      iVar9 = piVar5[4];
      piVar5[3] = iVar9;
      iVar8 = 0;
    }
    else {
      iVar9 = piVar5[3];
    }
    iVar6 = piVar7[-1] + iVar9;
    uVar3 = uVar4;
    if (piVar5[1] < iVar6) break;
    ((stbrp_rect *)(piVar7 + -5))->x = iVar8;
    piVar7[-4] = iVar9;
    *piVar7 = 1;
    piVar5[2] = iVar1 + iVar8;
    if (piVar5[4] < iVar6) {
      piVar5[4] = iVar6;
    }
    piVar7 = piVar7 + 6;
  }
  piVar5 = &rects[uVar3].was_packed;
  for (; (long)uVar3 < (long)num_rects; uVar3 = uVar3 + 1) {
    *piVar5 = 0;
    piVar5 = piVar5 + 6;
  }
  return;
}

Assistant:

STBTT_DEF void stbtt_PackFontRangesPackRects(stbtt_pack_context *spc, stbrp_rect *rects, int num_rects)
{
   stbrp_pack_rects((stbrp_context *) spc->pack_info, rects, num_rects);
}